

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall
BackwardPass::TransferCompoundedAddSubUsesToSrcs(BackwardPass *this,Instr *instr,int addSubUses)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  undefined4 *puVar4;
  StackSym *stackSym;
  int *piVar5;
  StackSym *srcSym;
  Opnd *pOStack_38;
  int i;
  Opnd *srcs [2];
  int local_1c;
  Instr *pIStack_18;
  int addSubUses_local;
  Instr *instr_local;
  BackwardPass *this_local;
  
  local_1c = addSubUses;
  pIStack_18 = instr;
  instr_local = (Instr *)this;
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1d1e,"(instr)","instr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (local_1c < 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1d1f,"(addSubUses >= 0)","addSubUses >= 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (0x15 < local_1c) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1d20,"(addSubUses <= MaxCompoundedUsesInAddSubForIgnoringIntOverflow)",
                       "addSubUses <= MaxCompoundedUsesInAddSubForIgnoringIntOverflow");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pOStack_38 = IR::Instr::GetSrc1(pIStack_18);
  srcs[0] = IR::Instr::GetSrc2(pIStack_18);
  srcSym._4_4_ = 0;
  while( true ) {
    bVar2 = false;
    if (srcSym._4_4_ < 2) {
      bVar2 = *(long *)((long)&stack0xffffffffffffffc8 + (long)(int)srcSym._4_4_ * 8) != 0;
    }
    if (!bVar2) break;
    stackSym = IR::RegOpnd::TryGetStackSym
                         (*(Opnd **)((long)&stack0xffffffffffffffc8 + (long)(int)srcSym._4_4_ * 8));
    if (stackSym != (StackSym *)0x0) {
      if ((stackSym->scratch).globOpt.numCompoundedAddSubUses < 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1d2d,"(srcSym->scratch.globOpt.numCompoundedAddSubUses >= 0)",
                           "srcSym->scratch.globOpt.numCompoundedAddSubUses >= 0");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      if (0x15 < (stackSym->scratch).globOpt.numCompoundedAddSubUses) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1d2e,
                           "(srcSym->scratch.globOpt.numCompoundedAddSubUses <= MaxCompoundedUsesInAddSubForIgnoringIntOverflow)"
                           ,
                           "srcSym->scratch.globOpt.numCompoundedAddSubUses <= MaxCompoundedUsesInAddSubForIgnoringIntOverflow"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      bVar2 = SetIntOverflowDoesNotMatterInRangeIfLastUse(this,stackSym,local_1c);
      if ((!bVar2) &&
         (BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                            (this->intOverflowDoesNotMatterInRangeBySymId,(stackSym->super_Sym).m_id
                            ), BVar3 != '\0')) {
        piVar5 = max<int>(&(stackSym->scratch).globOpt.numCompoundedAddSubUses,&local_1c);
        (stackSym->scratch).globOpt.numCompoundedAddSubUses = *piVar5;
      }
    }
    srcSym._4_4_ = srcSym._4_4_ + 1;
  }
  return;
}

Assistant:

void
BackwardPass::TransferCompoundedAddSubUsesToSrcs(IR::Instr *const instr, const int addSubUses)
{
    Assert(instr);
    Assert(addSubUses >= 0);
    Assert(addSubUses <= MaxCompoundedUsesInAddSubForIgnoringIntOverflow);

    IR::Opnd *const srcs[] = { instr->GetSrc1(), instr->GetSrc2() };
    for(int i = 0; i < _countof(srcs) && srcs[i]; ++i)
    {
        StackSym *const srcSym = IR::RegOpnd::TryGetStackSym(srcs[i]);
        if(!srcSym)
        {
            // Int overflow tracking is only done for StackSyms in RegOpnds. Int overflow matters for the src, so it is
            // guaranteed to be in the int range at this point if the instruction is int-specialized.
            continue;
        }

        Assert(srcSym->scratch.globOpt.numCompoundedAddSubUses >= 0);
        Assert(srcSym->scratch.globOpt.numCompoundedAddSubUses <= MaxCompoundedUsesInAddSubForIgnoringIntOverflow);

        if(SetIntOverflowDoesNotMatterInRangeIfLastUse(srcSym, addSubUses))
        {
            // This is the last use of the src
            continue;
        }

        if(intOverflowDoesNotMatterInRangeBySymId->Test(srcSym->m_id))
        {
            // Since a src may be compounded through different chains of add/sub instructions, the greater number must be
            // preserved
            srcSym->scratch.globOpt.numCompoundedAddSubUses =
                max(srcSym->scratch.globOpt.numCompoundedAddSubUses, addSubUses);
        }
        else
        {
            // Int overflow matters for the src, so it is guaranteed to be in the int range at this point if the instruction is
            // int-specialized
        }
    }
}